

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

void __thiscall jsonChildren::erase(jsonChildren *this,JSONNode ***position)

{
  uint uVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  allocator local_49;
  iteratorKeeper<false> ik;
  
  std::__cxx11::string::string((string *)&ik,"Children is null erase",&local_49);
  JSONDebug::_JSON_ASSERT(true,(json_string *)&ik);
  std::__cxx11::string::~string((string *)&ik);
  ppJVar2 = this->array;
  std::__cxx11::string::string((string *)&ik,"erasing something from a null array 1",&local_49);
  JSONDebug::_JSON_ASSERT(ppJVar2 != (JSONNode **)0x0,(json_string *)&ik);
  std::__cxx11::string::~string((string *)&ik);
  ppJVar2 = *position;
  ppJVar3 = this->array;
  std::__cxx11::string::string
            ((string *)&ik,"position is beneath the start of the array 1",&local_49);
  JSONDebug::_JSON_ASSERT(ppJVar3 <= ppJVar2,(json_string *)&ik);
  std::__cxx11::string::~string((string *)&ik);
  ppJVar2 = *position;
  ppJVar3 = this->array;
  uVar1 = this->mysize;
  std::__cxx11::string::string((string *)&ik,"erasing out of bounds 1",&local_49);
  JSONDebug::_JSON_ASSERT(ppJVar2 <= ppJVar3 + uVar1,(json_string *)&ik);
  std::__cxx11::string::~string((string *)&ik);
  ppJVar2 = *position;
  uVar1 = this->mysize;
  this->mysize = uVar1 - 1;
  memmove(ppJVar2,ppJVar2 + 1,
          (((ulong)~((long)ppJVar2 - (long)this->array) >> 3) + (ulong)uVar1) * 8);
  iteratorKeeper<false>::iteratorKeeper(&ik,this,position);
  shrink(this);
  iteratorKeeper<false>::~iteratorKeeper(&ik);
  return;
}

Assistant:

inline void erase(JSONNode ** & position) json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null erase"));
	   JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 1"));
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("erasing out of bounds 1"));
	   std::memmove(position, position + 1, (mysize-- - (position - array) - 1) * sizeof(JSONNode *));
	   iteratorKeeper<false> ik(this, position);
	   shrink();
    }